

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O0

bool __thiscall cmProcess::Buffer::GetLast(Buffer *this,string *line)

{
  string *psVar1;
  bool bVar2;
  reference pcVar3;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_28;
  string *local_20;
  string *line_local;
  Buffer *this_local;
  
  local_20 = line;
  line_local = (string *)this;
  bVar2 = std::vector<char,_std::allocator<char>_>::empty
                    (&this->super_vector<char,_std::allocator<char>_>);
  psVar1 = local_20;
  if (!bVar2) {
    local_28._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::begin
                           (&this->super_vector<char,_std::allocator<char>_>);
    pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&local_28);
    std::vector<char,_std::allocator<char>_>::size(&this->super_vector<char,_std::allocator<char>_>)
    ;
    std::__cxx11::string::assign((char *)psVar1,(ulong)pcVar3);
    this->Last = 0;
    this->First = 0;
    std::vector<char,_std::allocator<char>_>::clear
              (&this->super_vector<char,_std::allocator<char>_>);
  }
  this_local._7_1_ = !bVar2;
  return this_local._7_1_;
}

Assistant:

bool cmProcess::Buffer::GetLast(std::string& line)
{
  // Return the partial last line, if any.
  if (!this->empty()) {
    line.assign(&*this->begin(), this->size());
    this->First = this->Last = 0;
    this->clear();
    return true;
  }
  return false;
}